

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O0

void __thiscall DiskTable::~DiskTable(DiskTable *this)

{
  path local_260;
  path local_238;
  undefined1 local_210 [8];
  ofstream clock_os;
  DiskTable *this_local;
  
  std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
            (&local_260,(char (*) [13])"sstable.lock",auto_format);
  std::filesystem::__cxx11::operator/(&local_238,&this->db_home,&local_260);
  create_binary_ofstream((path *)local_210);
  std::filesystem::__cxx11::path::~path(&local_238);
  std::filesystem::__cxx11::path::~path(&local_260);
  bytes_write<unsigned_long>((ostream *)local_210,&this->SSTableClock,0);
  std::ofstream::~ofstream(local_210);
  std::filesystem::__cxx11::path::~path(&this->db_home);
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::~vector(&this->diskView);
  return;
}

Assistant:

DiskTable::~DiskTable() {
    auto clock_os = create_binary_ofstream(db_home / "sstable.lock");
    bytes_write(clock_os, &SSTableClock); // Sync SSTableClock to disk when exit.
}